

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O2

WebPMuxError
ChunkVerifyAndAssign(WebPChunk *chunk,uint8_t *data,size_t data_size,size_t riff_size,int copy_data)

{
  WebPMuxError WVar1;
  ulong uVar2;
  WebPData chunk_data;
  
  if (data_size < 8) {
    return WEBP_MUX_NOT_ENOUGH_DATA;
  }
  chunk_data.size = (size_t)*(uint *)(data + 4);
  WVar1 = WEBP_MUX_BAD_DATA;
  if (((chunk_data.size < 0xfffffff7) &&
      (uVar2 = (ulong)(*(uint *)(data + 4) + 1 & 0xfffffffe) + 8, uVar2 <= riff_size)) &&
     (WVar1 = WEBP_MUX_NOT_ENOUGH_DATA, uVar2 <= data_size)) {
    chunk_data.bytes = data + 8;
    WVar1 = ChunkAssignData(chunk,&chunk_data,copy_data,*(uint32_t *)data);
  }
  return WVar1;
}

Assistant:

static WebPMuxError ChunkVerifyAndAssign(WebPChunk* chunk,
                                         const uint8_t* data, size_t data_size,
                                         size_t riff_size, int copy_data) {
  uint32_t chunk_size;
  WebPData chunk_data;

  // Correctness checks.
  if (data_size < CHUNK_HEADER_SIZE) return WEBP_MUX_NOT_ENOUGH_DATA;
  chunk_size = GetLE32(data + TAG_SIZE);
  if (chunk_size > MAX_CHUNK_PAYLOAD) return WEBP_MUX_BAD_DATA;

  {
    const size_t chunk_disk_size = SizeWithPadding(chunk_size);
    if (chunk_disk_size > riff_size) return WEBP_MUX_BAD_DATA;
    if (chunk_disk_size > data_size) return WEBP_MUX_NOT_ENOUGH_DATA;
  }

  // Data assignment.
  chunk_data.bytes = data + CHUNK_HEADER_SIZE;
  chunk_data.size = chunk_size;
  return ChunkAssignData(chunk, &chunk_data, copy_data, GetLE32(data + 0));
}